

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.cc
# Opt level: O0

S1ChordAngle __thiscall S2Cell::GetMaxDistance(S2Cell *this,S2Point *a,S2Point *b)

{
  bool bVar1;
  S1ChordAngle *pSVar2;
  D local_90;
  D local_78;
  double local_60;
  S1ChordAngle local_58;
  double local_50;
  S1ChordAngle local_48;
  S1ChordAngle local_40;
  S1ChordAngle local_38;
  S2Cell *local_30;
  S1ChordAngle max_dist;
  S2Point *b_local;
  S2Point *a_local;
  S2Cell *this_local;
  
  max_dist.length2_ = (double)b;
  local_38 = GetMaxDistance(this,a);
  local_40 = GetMaxDistance(this,max_dist.length2_);
  pSVar2 = std::max<S1ChordAngle>(&local_38,&local_40);
  local_48.length2_ = pSVar2->length2_;
  local_30 = (S2Cell *)local_48.length2_;
  local_50 = (double)S1ChordAngle::Right();
  bVar1 = operator<=(local_48,(S1ChordAngle)local_50);
  if (bVar1) {
    this_local = local_30;
  }
  else {
    local_58 = S1ChordAngle::Straight();
    util::math::internal_vector::operator-(&local_78,a);
    util::math::internal_vector::operator-(&local_90,(D *)max_dist.length2_);
    local_60 = (double)GetDistance(this,&local_78,&local_90);
    this_local = (S2Cell *)::operator-(local_58,(S1ChordAngle)local_60);
  }
  return (S1ChordAngle)(double)this_local;
}

Assistant:

S1ChordAngle S2Cell::GetMaxDistance(const S2Point& a, const S2Point& b) const {
  // If the maximum distance from both endpoints to the cell is less than Pi/2
  // then the maximum distance from the edge to the cell is the maximum of the
  // two endpoint distances.
  S1ChordAngle max_dist = max(GetMaxDistance(a), GetMaxDistance(b));
  if (max_dist <= S1ChordAngle::Right()) {
    return max_dist;
  }

  return S1ChordAngle::Straight() - GetDistance(-a, -b);
}